

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O1

size_t __thiscall adios2::VariableNT::SelectionSize(VariableNT *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VariableBase *pointer;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  string type;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  pointer = this->m_Variable;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"in call to VariableNT::SelectionSize","");
  helper::CheckForNullptr<adios2::core::VariableBase>(pointer,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  adios2::ToString_abi_cxx11_((DataType)&local_c8);
  GetType<std::__cxx11::string>();
  if (local_c8._M_string_length == local_e8._M_string_length) {
    if (local_c8._M_string_length == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,local_c8._M_string_length);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  paVar1 = &local_e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (bVar4) {
    sVar3 = adios2::core::Variable<std::__cxx11::string>::SelectionSize();
  }
  else {
    GetType<char>();
    if (local_c8._M_string_length == local_e8._M_string_length) {
      if (local_c8._M_string_length == 0) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,local_c8._M_string_length);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (bVar4) {
      sVar3 = adios2::core::Variable<char>::SelectionSize();
    }
    else {
      GetType<signed_char>();
      if (local_c8._M_string_length == local_e8._M_string_length) {
        if (local_c8._M_string_length == 0) {
          bVar4 = true;
        }
        else {
          iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,local_c8._M_string_length
                      );
          bVar4 = iVar2 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (bVar4) {
        sVar3 = adios2::core::Variable<signed_char>::SelectionSize();
      }
      else {
        GetType<short>();
        if (local_c8._M_string_length == local_e8._M_string_length) {
          if (local_c8._M_string_length == 0) {
            bVar4 = true;
          }
          else {
            iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                         local_c8._M_string_length);
            bVar4 = iVar2 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if (bVar4) {
          sVar3 = adios2::core::Variable<short>::SelectionSize();
        }
        else {
          GetType<int>();
          if (local_c8._M_string_length == local_e8._M_string_length) {
            if (local_c8._M_string_length == 0) {
              bVar4 = true;
            }
            else {
              iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                           local_c8._M_string_length);
              bVar4 = iVar2 == 0;
            }
          }
          else {
            bVar4 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != paVar1) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if (bVar4) {
            sVar3 = adios2::core::Variable<int>::SelectionSize();
          }
          else {
            GetType<long>();
            if (local_c8._M_string_length == local_e8._M_string_length) {
              if (local_c8._M_string_length == 0) {
                bVar4 = true;
              }
              else {
                iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                             local_c8._M_string_length);
                bVar4 = iVar2 == 0;
              }
            }
            else {
              bVar4 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != paVar1) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            if (bVar4) {
              sVar3 = adios2::core::Variable<long>::SelectionSize();
            }
            else {
              GetType<unsigned_char>();
              if (local_c8._M_string_length == local_e8._M_string_length) {
                if (local_c8._M_string_length == 0) {
                  bVar4 = true;
                }
                else {
                  iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                               local_c8._M_string_length);
                  bVar4 = iVar2 == 0;
                }
              }
              else {
                bVar4 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != paVar1) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              if (bVar4) {
                sVar3 = adios2::core::Variable<unsigned_char>::SelectionSize();
              }
              else {
                GetType<unsigned_short>();
                if (local_c8._M_string_length == local_e8._M_string_length) {
                  if (local_c8._M_string_length == 0) {
                    bVar4 = true;
                  }
                  else {
                    iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                                 local_c8._M_string_length);
                    bVar4 = iVar2 == 0;
                  }
                }
                else {
                  bVar4 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_e8._M_dataplus._M_p);
                }
                if (bVar4) {
                  sVar3 = adios2::core::Variable<unsigned_short>::SelectionSize();
                }
                else {
                  GetType<unsigned_int>();
                  if (local_c8._M_string_length == local_e8._M_string_length) {
                    if (local_c8._M_string_length == 0) {
                      bVar4 = true;
                    }
                    else {
                      iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                                   local_c8._M_string_length);
                      bVar4 = iVar2 == 0;
                    }
                  }
                  else {
                    bVar4 = false;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_e8._M_dataplus._M_p);
                  }
                  if (bVar4) {
                    sVar3 = adios2::core::Variable<unsigned_int>::SelectionSize();
                  }
                  else {
                    GetType<unsigned_long>();
                    if (local_c8._M_string_length == local_e8._M_string_length) {
                      if (local_c8._M_string_length == 0) {
                        bVar4 = true;
                      }
                      else {
                        iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                                     local_c8._M_string_length);
                        bVar4 = iVar2 == 0;
                      }
                    }
                    else {
                      bVar4 = false;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_e8._M_dataplus._M_p);
                    }
                    if (bVar4) {
                      sVar3 = adios2::core::Variable<unsigned_long>::SelectionSize();
                    }
                    else {
                      GetType<float>();
                      if (local_c8._M_string_length == local_e8._M_string_length) {
                        if (local_c8._M_string_length == 0) {
                          bVar4 = true;
                        }
                        else {
                          iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                                       local_c8._M_string_length);
                          bVar4 = iVar2 == 0;
                        }
                      }
                      else {
                        bVar4 = false;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != paVar1) {
                        operator_delete(local_e8._M_dataplus._M_p);
                      }
                      if (bVar4) {
                        sVar3 = adios2::core::Variable<float>::SelectionSize();
                      }
                      else {
                        GetType<double>();
                        if (local_c8._M_string_length == local_e8._M_string_length) {
                          if (local_c8._M_string_length == 0) {
                            bVar4 = true;
                          }
                          else {
                            iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                                         local_c8._M_string_length);
                            bVar4 = iVar2 == 0;
                          }
                        }
                        else {
                          bVar4 = false;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_e8._M_dataplus._M_p != paVar1) {
                          operator_delete(local_e8._M_dataplus._M_p);
                        }
                        if (bVar4) {
                          sVar3 = adios2::core::Variable<double>::SelectionSize();
                        }
                        else {
                          GetType<long_double>();
                          if (local_c8._M_string_length == local_e8._M_string_length) {
                            if (local_c8._M_string_length == 0) {
                              bVar4 = true;
                            }
                            else {
                              iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                                           local_c8._M_string_length);
                              bVar4 = iVar2 == 0;
                            }
                          }
                          else {
                            bVar4 = false;
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_e8._M_dataplus._M_p != paVar1) {
                            operator_delete(local_e8._M_dataplus._M_p);
                          }
                          if (bVar4) {
                            sVar3 = adios2::core::Variable<long_double>::SelectionSize();
                          }
                          else {
                            GetType<std::complex<float>>();
                            if (local_c8._M_string_length == local_e8._M_string_length) {
                              if (local_c8._M_string_length == 0) {
                                bVar4 = true;
                              }
                              else {
                                iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                                             local_c8._M_string_length);
                                bVar4 = iVar2 == 0;
                              }
                            }
                            else {
                              bVar4 = false;
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_e8._M_dataplus._M_p != paVar1) {
                              operator_delete(local_e8._M_dataplus._M_p);
                            }
                            if (bVar4) {
                              sVar3 = adios2::core::Variable<std::complex<float>>::SelectionSize();
                            }
                            else {
                              GetType<std::complex<double>>();
                              if (local_c8._M_string_length == local_e8._M_string_length) {
                                if (local_c8._M_string_length == 0) {
                                  bVar4 = true;
                                }
                                else {
                                  iVar2 = bcmp(local_c8._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                                               local_c8._M_string_length);
                                  bVar4 = iVar2 == 0;
                                }
                              }
                              else {
                                bVar4 = false;
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_e8._M_dataplus._M_p != paVar1) {
                                operator_delete(local_e8._M_dataplus._M_p);
                              }
                              if (bVar4) {
                                sVar3 = adios2::core::Variable<std::complex<double>>::SelectionSize
                                                  ();
                              }
                              else {
                                local_e8._M_dataplus._M_p = (pointer)paVar1;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_e8,"bindings::CXX11","");
                                local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_88,"VariableNT","");
                                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_a8,"SelectionSize","");
                                std::operator+(&local_68,"invalid data type ",&local_c8);
                                helper::Throw<std::runtime_error>
                                          (&local_e8,&local_88,&local_a8,&local_68,-1);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                                  operator_delete(local_68._M_dataplus._M_p);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                                  operator_delete(local_a8._M_dataplus._M_p);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                                  operator_delete(local_88._M_dataplus._M_p);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_e8._M_dataplus._M_p != paVar1) {
                                  operator_delete(local_e8._M_dataplus._M_p);
                                }
                                sVar3 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return sVar3;
}

Assistant:

size_t VariableNT::SelectionSize() const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::SelectionSize");
    auto type = ToString(m_Variable->m_Type);
#define declare_type(T)                                                                            \
    if (type == GetType<T>())                                                                      \
    {                                                                                              \
        return reinterpret_cast<core::Variable<T> *>(m_Variable)->SelectionSize();                 \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "SelectionSize",
                                      "invalid data type " + type);
    return 0;
}